

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::ParseAnyTypeUrl
          (internal *this,string_view type_url,string *url_prefix,string *full_type_name)

{
  bool bVar1;
  internal *piVar2;
  internal *piVar3;
  size_t sVar5;
  long *local_50 [2];
  long local_40 [2];
  internal *piVar4;
  
  sVar5 = type_url._M_len;
  piVar4 = this;
  if (this == (internal *)0x0) {
LAB_00325248:
    piVar3 = (internal *)0xffffffffffffffff;
  }
  else {
    do {
      piVar3 = piVar4 + -1;
      if (piVar4 == (internal *)0x0) goto LAB_00325248;
      piVar2 = piVar4 + (sVar5 - 1);
      piVar4 = piVar3;
    } while (*piVar2 != (internal)0x2f);
  }
  if ((piVar3 == (internal *)0xffffffffffffffff) || (piVar4 = piVar3 + 1, piVar4 == this)) {
    bVar1 = false;
  }
  else {
    if ((string *)type_url._M_str != (string *)0x0) {
      piVar2 = piVar4;
      if (this < piVar4) {
        piVar2 = this;
      }
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,sVar5,piVar2 + sVar5);
      std::__cxx11::string::operator=((string *)type_url._M_str,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
    if (this <= piVar3) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 piVar4,this);
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,piVar4 + sVar5,this + sVar5);
    std::__cxx11::string::operator=((string *)url_prefix,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool ParseAnyTypeUrl(absl::string_view type_url,
                     std::string* PROTOBUF_NULLABLE url_prefix,
                     std::string* PROTOBUF_NONNULL full_type_name) {
  size_t pos = type_url.find_last_of('/');
  if (pos == std::string::npos || pos + 1 == type_url.size()) {
    return false;
  }
  if (url_prefix) {
    *url_prefix = std::string(type_url.substr(0, pos + 1));
  }
  *full_type_name = std::string(type_url.substr(pos + 1));
  return true;
}